

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONDebug.cpp
# Opt level: O1

json_error_callback_t JSONDebug::register_callback(json_error_callback_t callback)

{
  json_error_callback_t p_Var1;
  
  if (JSONSingleton<void(*)(std::__cxx11::string_const&)>::get_singleton()::instance_abi_cxx11_ ==
      '\0') {
    register_callback();
  }
  p_Var1 = JSONSingleton<void(*)(std::__cxx11::string_const&)>::get_singleton()::instance_abi_cxx11_
  ;
  if (JSONSingleton<void(*)(std::__cxx11::string_const&)>::get_singleton()::instance_abi_cxx11_ ==
      '\0') {
    register_callback();
  }
  JSONSingleton<void(*)(std::__cxx11::string_const&)>::get_singleton()::instance_abi_cxx11_ =
       callback;
  return p_Var1;
}

Assistant:

json_error_callback_t JSONDebug::register_callback(json_error_callback_t callback) json_nothrow {
		json_error_callback_t res = JSONSingleton<json_error_callback_t>::get();
        JSONSingleton<json_error_callback_t>::set(callback);
		return res;
    }